

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::
JavaGeneratorTest_NestInFileClassFeatureInNetsedEnumError_Test::
~JavaGeneratorTest_NestInFileClassFeatureInNetsedEnumError_Test
          (JavaGeneratorTest_NestInFileClassFeatureInNetsedEnumError_Test *this)

{
  JavaGeneratorTest_NestInFileClassFeatureInNetsedEnumError_Test *this_local;
  
  ~JavaGeneratorTest_NestInFileClassFeatureInNetsedEnumError_Test(this);
  operator_delete(this,0x2d0);
  return;
}

Assistant:

TEST_F(JavaGeneratorTest, NestInFileClassFeatureInNetsedEnumError) {
  CreateTempFile("foo.proto",
                 R"schema(
      edition = "2024";
      package proto2_unittest;
      import "third_party/java/protobuf/java_features.proto";
      message Message {
        int32 unused = 1;
        enum NestedEnum {
          option features.(pb.java).nest_in_file_class = YES;
          FOO_DEFAULT = 0;
          FOO_VALUE = 1;
        }
      }
  )schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --java_out=$tmpdir "
      "--experimental_editions foo.proto");

  ExpectErrorSubstring(
      "Feature pb.java.nest_in_file_class only applies to top-level types and "
      "is not allowed to be set on the nested type: "
      "proto2_unittest.Message.NestedEnum");
}